

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

App * __thiscall CLI::App::needs(App *this,Option *opt)

{
  OptionNotFound *this_00;
  allocator local_41;
  Option *opt_local;
  string local_38;
  
  opt_local = opt;
  if (opt != (Option *)0x0) {
    ::std::
    _Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
    ::_M_insert_unique<CLI::Option*const&>
              ((_Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
                *)&this->need_options_,&opt_local);
    return this;
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_38,"nullptr passed",&local_41);
  OptionNotFound::OptionNotFound(this_00,&local_38);
  __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

App *needs(Option *opt) {
        if(opt == nullptr) {
            throw OptionNotFound("nullptr passed");
        }
        need_options_.insert(opt);
        return this;
    }